

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i64 sqlite3BtreeRowCountEst(BtCursor *pCur)

{
  byte local_21;
  BtCursor *pBStack_20;
  u8 i;
  i64 n;
  BtCursor *pCur_local;
  
  if (pCur->eState == '\0') {
    if (pCur->pPage->leaf == '\0') {
      pCur_local = (BtCursor *)0xffffffffffffffff;
    }
    else {
      pBStack_20 = (BtCursor *)(ulong)pCur->pPage->nCell;
      for (local_21 = 0; (int)(uint)local_21 < (int)pCur->iPage; local_21 = local_21 + 1) {
        pBStack_20 = (BtCursor *)((ulong)pCur->apPage[local_21]->nCell * (long)pBStack_20);
      }
      pCur_local = pBStack_20;
    }
  }
  else {
    pCur_local = (BtCursor *)0xffffffffffffffff;
  }
  return (i64)pCur_local;
}

Assistant:

SQLITE_PRIVATE i64 sqlite3BtreeRowCountEst(BtCursor *pCur){
  i64 n;
  u8 i;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );

  /* Currently this interface is only called by the OP_IfSmaller
  ** opcode, and it that case the cursor will always be valid and
  ** will always point to a leaf node. */
  if( NEVER(pCur->eState!=CURSOR_VALID) ) return -1;
  if( NEVER(pCur->pPage->leaf==0) ) return -1;

  n = pCur->pPage->nCell;
  for(i=0; i<pCur->iPage; i++){
    n *= pCur->apPage[i]->nCell;
  }
  return n;
}